

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

KeyValue<supermap::Key<2UL>,_unsigned_int> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>::
get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
    *this,uint index)

{
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
  *in_RDI;
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_6UL,_void>
  *in_stack_ffffffffffffff48;
  path *this_00;
  format in_stack_ffffffffffffff77;
  string_type *in_stack_ffffffffffffff78;
  path *in_stack_ffffffffffffff80;
  FileManager *in_stack_ffffffffffffff88;
  path local_38;
  KeyValue<supermap::Key<2UL>,_unsigned_int> local_8;
  
  this_00 = &local_38;
  getFileManager(in_RDI);
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x15412f);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>::
  getStorageFilePath_abi_cxx11_(in_RDI);
  std::filesystem::__cxx11::path::path
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff77);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(uint64_t)in_stack_ffffffffffffff78
            );
  local_8 = io::
            InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_6UL,_void>
            ::next(in_stack_ffffffffffffff48);
  io::InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_6UL,_void>::
  ~InputIterator((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_6UL,_void>
                  *)0x1541b1);
  std::filesystem::__cxx11::path::~path(this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x1541d2);
  return local_8;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }